

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O3

UChar32 ucnv_getNextUChar_UTF8(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  UConverter *pUVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  
  pbVar4 = (byte *)args->source;
  if (args->sourceLimit <= pbVar4) {
    *err = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0xffff;
  }
  pbVar9 = pbVar4 + 1;
  bVar2 = *pbVar4;
  uVar6 = (uint)bVar2;
  if (-1 < (char)bVar2) {
    args->source = (char *)pbVar9;
    return uVar6;
  }
  pUVar5 = args->converter;
  if (0x32 < (byte)(bVar2 + 0x3e)) {
    pUVar5->toUBytes[0] = bVar2;
    pUVar5->toULength = '\x01';
    *err = U_ILLEGAL_CHAR_FOUND;
LAB_0016afc9:
    args->source = (char *)pbVar9;
    return 0xffff;
  }
  uVar10 = ((0xdf < bVar2) + 1) - (uint)(bVar2 < 0xf0);
  if (args->sourceLimit < pbVar9 + (ulong)uVar10 + 1) {
    pUVar5->toUBytes[0] = bVar2;
    *err = U_TRUNCATED_CHAR_FOUND;
    lVar12 = 1;
    if (pbVar9 < args->sourceLimit) {
      lVar12 = 1;
      do {
        bVar3 = pbVar4[lVar12];
        if (uVar10 == 0 || '\x01' < (char)lVar12) {
          bVar13 = (char)bVar3 < -0x40;
        }
        else if (0xdf < bVar2 == 0xef < bVar2) {
          bVar13 = ""[bVar3 >> 4] & '\x01' << (bVar2 & 7);
        }
        else {
          bVar13 = '\x01' << (bVar3 >> 5) & " 000000000000\x1000"[uVar6 & 0xf];
        }
        if (bVar13 == 0) {
          *err = U_ILLEGAL_CHAR_FOUND;
          break;
        }
        pUVar5->toUBytes[(char)lVar12] = bVar3;
        lVar7 = lVar12 + 1;
        lVar12 = lVar12 + 1;
      } while (pbVar4 + lVar7 < args->sourceLimit);
      pbVar9 = pbVar4 + lVar12;
    }
    pUVar5->toULength = (int8_t)lVar12;
    goto LAB_0016afc9;
  }
  iVar8 = uVar6 * 0x40;
  bVar2 = *pbVar9;
  uVar11 = (uint)bVar2;
  if (uVar10 == 0) {
    if ((char)bVar2 < -0x40) {
      args->source = (char *)(pbVar4 + 2);
      return iVar8 + uVar11 + -0x3080;
    }
    goto LAB_0016afdf;
  }
  if (uVar10 == 1) {
    if (((byte)" 000000000000\x1000"[uVar6 & 0xf] >> (bVar2 >> 5) & 1) == 0) goto LAB_0016afdf;
    bVar2 = pbVar4[2];
    if ((char)bVar2 < -0x40) {
      args->source = (char *)(pbVar4 + 3);
      return (uint)bVar2 + (iVar8 + uVar11) * 0x40 + -0xe2080;
    }
  }
  else {
    if (((byte)""[bVar2 >> 4] >> (uVar6 & 7) & 1) == 0) goto LAB_0016afdf;
    bVar2 = pbVar4[2];
    if ((char)bVar2 < -0x40) {
      bVar3 = pbVar4[3];
      if ((char)bVar3 < -0x40) {
        args->source = (char *)(pbVar4 + 4);
        return (uint)bVar2 * 0x40 + (iVar8 + uVar11) * 0x1000 + (uint)bVar3 + -0x3c82080;
      }
      pbVar9 = pbVar4 + 3;
      goto LAB_0016afdf;
    }
  }
  pbVar9 = pbVar4 + 2;
LAB_0016afdf:
  args->source = (char *)pbVar9;
  lVar12 = 0;
  do {
    pbVar1 = pbVar4 + lVar12;
    pUVar5->toUBytes[(char)lVar12] = *pbVar1;
    lVar12 = lVar12 + 1;
  } while (pbVar1 + 1 < pbVar9);
  pUVar5->toULength = (int8_t)lVar12;
  *err = U_ILLEGAL_CHAR_FOUND;
  return 0xffff;
}

Assistant:

U_CDECL_BEGIN
static UChar32 U_CALLCONV ucnv_getNextUChar_UTF8(UConverterToUnicodeArgs *args,
                                               UErrorCode *err) {
    UConverter *cnv;
    const uint8_t *sourceInitial;
    const uint8_t *source;
    uint8_t myByte;
    UChar32 ch;
    int8_t i;

    /* UTF-8 only here, the framework handles CESU-8 to combine surrogate pairs */

    cnv = args->converter;
    sourceInitial = source = (const uint8_t *)args->source;
    if (source >= (const uint8_t *)args->sourceLimit)
    {
        /* no input */
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0xffff;
    }

    myByte = (uint8_t)*(source++);
    if (U8_IS_SINGLE(myByte))
    {
        args->source = (const char *)source;
        return (UChar32)myByte;
    }

    uint16_t countTrailBytes = U8_COUNT_TRAIL_BYTES(myByte);
    if (countTrailBytes == 0) {
        cnv->toUBytes[0] = myByte;
        cnv->toULength = 1;
        *err = U_ILLEGAL_CHAR_FOUND;
        args->source = (const char *)source;
        return 0xffff;
    }

    /*The byte sequence is longer than the buffer area passed*/
    if (((const char *)source + countTrailBytes) > args->sourceLimit)
    {
        /* check if all of the remaining bytes are trail bytes */
        uint16_t extraBytesToWrite = countTrailBytes + 1;
        cnv->toUBytes[0] = myByte;
        i = 1;
        *err = U_TRUNCATED_CHAR_FOUND;
        while(source < (const uint8_t *)args->sourceLimit) {
            uint8_t b = *source;
            if(icu::UTF8::isValidTrail(myByte, b, i, extraBytesToWrite)) {
                cnv->toUBytes[i++] = b;
                ++source;
            } else {
                /* error even before we run out of input */
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
        cnv->toULength = i;
        args->source = (const char *)source;
        return 0xffff;
    }

    ch = myByte << 6;
    if(countTrailBytes == 2) {
        uint8_t t1 = *source, t2;
        if(U8_IS_VALID_LEAD3_AND_T1(myByte, t1) && U8_IS_TRAIL(t2 = *++source)) {
            args->source = (const char *)(source + 1);
            return (((ch + t1) << 6) + t2) - offsetsFromUTF8[3];
        }
    } else if(countTrailBytes == 1) {
        uint8_t t1 = *source;
        if(U8_IS_TRAIL(t1)) {
            args->source = (const char *)(source + 1);
            return (ch + t1) - offsetsFromUTF8[2];
        }
    } else {  // countTrailBytes == 3
        uint8_t t1 = *source, t2, t3;
        if(U8_IS_VALID_LEAD4_AND_T1(myByte, t1) && U8_IS_TRAIL(t2 = *++source) &&
                U8_IS_TRAIL(t3 = *++source)) {
            args->source = (const char *)(source + 1);
            return (((((ch + t1) << 6) + t2) << 6) + t3) - offsetsFromUTF8[4];
        }
    }
    args->source = (const char *)source;

    for(i = 0; sourceInitial < source; ++i) {
        cnv->toUBytes[i] = *sourceInitial++;
    }
    cnv->toULength = i;
    *err = U_ILLEGAL_CHAR_FOUND;
    return 0xffff;
}